

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O1

int CCharmap::name_is_ucs2be_synonym(char *table_name)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = stricmp(table_name,"utf-16be");
  uVar2 = 1;
  if (iVar1 != 0) {
    iVar1 = stricmp(table_name,"utf16be");
    if (iVar1 != 0) {
      iVar1 = stricmp(table_name,"utf_16be");
      if (iVar1 != 0) {
        iVar1 = stricmp(table_name,"unicodeb");
        if (iVar1 != 0) {
          iVar1 = stricmp(table_name,"unicode-b");
          if (iVar1 != 0) {
            iVar1 = stricmp(table_name,"unicode-be");
            if (iVar1 != 0) {
              iVar1 = stricmp(table_name,"ucs-2be");
              if (iVar1 != 0) {
                iVar1 = stricmp(table_name,"ucs2be");
                uVar2 = (uint)(iVar1 == 0);
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int name_is_ucs2be_synonym(const char *table_name)
    {
        return (stricmp(table_name, "utf-16be") == 0
                || stricmp(table_name, "utf16be") == 0
                || stricmp(table_name, "utf_16be") == 0
                || stricmp(table_name, "unicodeb") == 0
                || stricmp(table_name, "unicode-b") == 0
                || stricmp(table_name, "unicode-be") == 0
                || stricmp(table_name, "ucs-2be") == 0
                || stricmp(table_name, "ucs2be") == 0);
    }